

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

bool __thiscall IRBuilder::DoBailOnNoProfile(IRBuilder *this)

{
  bool bVar1;
  uint16 uVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *pJVar3;
  FunctionJITTimeInfo *this_00;
  JITTimeProfileInfo *this_01;
  Func *pFVar4;
  
  pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->topFunc->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar3);
  this_00 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->topFunc->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,BailOnNoProfilePhase,sourceContextId,functionId);
  if ((!bVar1) &&
     (uVar2 = JITTimeWorkItem::GetProfiledIterations(this->m_func->topFunc->m_workItem), uVar2 != 0)
     ) {
    pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar3);
    if (bVar1) {
      pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      this_01 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar3);
      bVar1 = JITTimeProfileInfo::IsNoProfileBailoutsDisabled(this_01);
      if (bVar1) {
        return false;
      }
    }
    bVar1 = Func::DoGlobOpt(this->m_func);
    if (bVar1) {
      pFVar4 = this->m_func;
      if (pFVar4->topFunc != pFVar4) {
        bVar1 = Js::ConfigFlagsTable::IsEnabled
                          ((ConfigFlagsTable *)&Js::Configuration::Global,ForceJITLoopBodyFlag);
        if (bVar1) {
          return false;
        }
        pFVar4 = this->m_func;
      }
      pJVar3 = JITTimeWorkItem::GetJITFunctionBody(pFVar4->m_workItem);
      bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar3);
      if (bVar1) {
        pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->topFunc->m_workItem);
        bVar1 = JITTimeFunctionBody::IsCoroutine(pJVar3);
        if ((!bVar1) || (bVar1 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem), bVar1)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool
IRBuilder::DoBailOnNoProfile()
{
    if (PHASE_OFF(Js::BailOnNoProfilePhase, this->m_func->GetTopFunc()))
    {
        return false;
    }

    Func *const topFunc = m_func->GetTopFunc();
    if(topFunc->GetWorkItem()->GetProfiledIterations() == 0)
    {
        // The top function has not been profiled yet. Some switch must have been used to force jitting. This is not a
        // real-world case, but for the purpose of testing the JIT, it's beneficial to generate code in unprofiled paths.
        return false;
    }

    if (m_func->HasProfileInfo() && m_func->GetReadOnlyProfileInfo()->IsNoProfileBailoutsDisabled())
    {
        return false;
    }

    if (!m_func->DoGlobOpt())
    {
        return false;
    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (this->m_func->GetTopFunc() != this->m_func && Js::Configuration::Global.flags.IsEnabled(Js::ForceJITLoopBodyFlag))
    {
        // No profile data for loop bodies with -force...
        return false;
    }
#endif

    if (!this->m_func->HasProfileInfo())
    {
        return false;
    }

    if (m_func->GetTopFunc()->GetJITFunctionBody()->IsCoroutine() && !m_func->IsLoopBody())
    {
        return false;
    }

    return true;
}